

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void inlet_fwd(_inlet *x,t_symbol *s,int argc,t_atom *argv)

{
  undefined4 uVar1;
  t_pd *x_00;
  t_atom *ptVar2;
  t_symbol *s_00;
  long lVar3;
  t_atom *ptVar4;
  int argc_00;
  undefined8 uStack_60;
  t_atom tStack_58;
  t_pd *local_40;
  int local_34;
  t_atom *ptStack_30;
  int i;
  t_atom *argvec;
  t_atom *argv_local;
  t_symbol *ptStack_18;
  int argc_local;
  t_symbol *s_local;
  _inlet *x_local;
  
  lVar3 = (long)argc;
  ptStack_30 = &tStack_58 + -lVar3;
  argvec = argv;
  argv_local._4_4_ = argc;
  ptStack_18 = s;
  s_local = (t_symbol *)x;
  ptStack_30->a_type = A_SYMBOL;
  (ptStack_30->a_w).w_symbol = ptStack_18;
  for (local_34 = 0; local_34 < argv_local._4_4_; local_34 = local_34 + 1) {
    ptVar2 = ptStack_30 + (local_34 + 1);
    ptVar4 = argvec + local_34;
    uVar1 = *(undefined4 *)&ptVar4->field_0x4;
    ptVar2->a_type = ptVar4->a_type;
    *(undefined4 *)&ptVar2->field_0x4 = uVar1;
    ptVar2->a_w = ptVar4->a_w;
  }
  local_40 = (t_pd *)s_local[1].s_name;
  (&uStack_60)[lVar3 * -2] = 0x1a3bda;
  s_00 = gensym("fwd");
  ptVar2 = ptStack_30;
  x_00 = local_40;
  argc_00 = argv_local._4_4_ + 1;
  (&uStack_60)[lVar3 * -2] = 0x1a3bf0;
  pd_typedmess(x_00,s_00,argc_00,ptVar2);
  return;
}

Assistant:

static void inlet_fwd(t_inlet *x, t_symbol *s, int argc, t_atom *argv)
{
    t_atom *argvec = (t_atom *)alloca((argc+1) * sizeof(t_atom));
    int i;
    SETSYMBOL(argvec, s);
    for (i = 0; i < argc; i++)
        argvec[i+1] = argv[i];
    typedmess(x->i_dest, gensym("fwd"), argc+1, argvec);
}